

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_archive_extract(mz_zip_archive *zip_archive,char *dir,
                       _func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  mz_bool mVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  size_t __n;
  mz_uint file_index;
  bool bVar16;
  bool bVar17;
  char path [513];
  mz_zip_archive_file_stat info;
  char symlink_to [513];
  uint local_ac4;
  undefined8 local_ab0;
  char local_aa8 [520];
  mz_zip_archive_file_stat local_8a0;
  char local_448 [528];
  char local_238 [520];
  
  local_ab0 = arg;
  memset(local_aa8,0,0x201);
  memset(local_448,0,0x201);
  uVar8 = strlen(dir);
  iVar5 = -2;
  if (uVar8 + 1 < 0x201) {
    local_ac4 = 0;
    memset(&local_8a0,0,0x458);
    strncpy(local_aa8,dir,0x200);
    cVar3 = local_aa8[uVar8 - 1];
    if ((cVar3 != '/') && (cVar3 != '\\')) {
      local_aa8[uVar8] = '/';
      uVar8 = uVar8 + 1;
    }
    __n = 0x200 - uVar8;
    if (0x1ff < __n) {
      __n = 0x200;
    }
    if (zip_archive != (mz_zip_archive *)0x0) {
      local_ac4 = zip_archive->m_total_files;
    }
    if (local_ac4 == 0) {
      iVar6 = 0;
    }
    else {
      file_index = 0;
      mVar4 = mz_zip_reader_file_stat(zip_archive,0,&local_8a0);
      if (mVar4 != 0) {
LAB_001105f2:
        cVar3 = local_8a0.m_filename[0];
        iVar6 = -2;
        if (local_8a0.m_filename[0] != '\0') {
          for (pcVar11 = local_8a0.m_filename; (*pcVar11 == '/' || (*pcVar11 == '\\'));
              pcVar11 = pcVar11 + 1) {
          }
          lVar12 = 0;
          do {
            pcVar10 = local_8a0.m_filename + lVar12;
            lVar15 = 0;
            do {
              do {
                while( true ) {
                  lVar14 = lVar15;
                  cVar2 = *pcVar11;
                  pcVar11 = pcVar11 + 1;
                  if ((cVar2 == '/') || (cVar2 == '\\')) break;
                  if (cVar2 == '\0') {
                    if (lVar14 == 0) goto LAB_001106b9;
                    lVar12 = 0;
                    goto LAB_001106a6;
                  }
                  pcVar10[lVar14] = cVar2;
                  lVar15 = lVar14 + 1;
                }
                lVar15 = 0;
              } while (lVar14 == 0);
              lVar15 = 0;
              do {
                pcVar1 = pcVar10 + lVar15;
                if (*pcVar1 != '.') break;
                bVar17 = lVar14 + -1 != lVar15;
                lVar15 = lVar15 + 1;
              } while (bVar17);
              lVar15 = 0;
            } while (*pcVar1 == '.');
            lVar15 = lVar14 + lVar12;
            lVar12 = lVar12 + lVar14 + 1;
            local_8a0.m_filename[lVar15] = cVar2;
          } while( true );
        }
        goto LAB_00110892;
      }
LAB_00110889:
      iVar6 = -3;
    }
LAB_00110892:
    mVar4 = mz_zip_reader_end_internal(zip_archive,1);
    iVar5 = -0x19;
    if (mVar4 != 0) {
      iVar5 = iVar6;
    }
  }
  return iVar5;
  while (lVar12 = lVar12 + 1, lVar14 != lVar12) {
LAB_001106a6:
    if (pcVar10[lVar12] != '.') {
      pcVar10 = pcVar10 + lVar14;
      break;
    }
  }
LAB_001106b9:
  *pcVar10 = '\0';
  if (cVar3 == '\0') goto LAB_00110892;
  strncpy(local_aa8 + uVar8,local_8a0.m_filename,__n);
  iVar5 = 0;
  memset(local_238,0,0x201);
  if (local_aa8[0] == '\0') {
    bVar17 = false;
  }
  else {
    uVar13 = 0;
    cVar3 = local_aa8[0];
    do {
      if (((cVar3 == '\\') || (cVar3 == '/')) && (uVar13 != 0)) {
        if (cVar3 == '\\') {
          local_aa8[uVar13] = '/';
        }
        iVar5 = mkdir(local_238,0x1ed);
        if ((iVar5 == -1) && (piVar9 = __errno_location(), *piVar9 != 0x11)) {
          iVar5 = -0x17;
          bVar17 = true;
          break;
        }
      }
      cVar3 = local_aa8[uVar13 + 1];
      local_238[uVar13] = local_aa8[uVar13];
      bVar17 = false;
      if (cVar3 == '\0') {
        iVar5 = 0;
        break;
      }
      iVar5 = 0;
      bVar16 = uVar13 < 0x1ff;
      uVar13 = uVar13 + 1;
    } while (bVar16);
  }
  iVar6 = iVar5;
  if (bVar17) goto LAB_00110892;
  if (((local_8a0.m_version_made_by._1_1_ | 0x10) == 0x13) &&
     ((local_8a0.m_external_attr & 0x20000000) != 0)) {
    iVar6 = -0x12;
    if ((0x200 < local_8a0.m_uncomp_size) ||
       (mVar4 = mz_zip_reader_extract_to_mem_no_alloc1
                          (zip_archive,file_index,local_448,0x200,0,(void *)0x0,0,
                           (mz_zip_archive_file_stat *)0x0), mVar4 == 0)) goto LAB_00110892;
    local_448[local_8a0.m_uncomp_size] = '\0';
    iVar6 = symlink(local_448,local_aa8);
    if (iVar6 != 0) {
      iVar6 = -0x18;
      goto LAB_00110892;
    }
  }
  else {
    mVar4 = mz_zip_reader_is_file_a_directory(zip_archive,file_index);
    if ((mVar4 == 0) &&
       (mVar4 = mz_zip_reader_extract_to_file(zip_archive,file_index,local_aa8,0), mVar4 == 0)) {
      iVar6 = -0x13;
      goto LAB_00110892;
    }
    if ((0xffff < local_8a0.m_external_attr) &&
       (iVar6 = chmod(local_aa8,local_8a0.m_external_attr >> 0x10), iVar6 < 0)) {
      iVar6 = -0x14;
      goto LAB_00110892;
    }
  }
  if (((on_extract != (_func_int_char_ptr_void_ptr *)0x0) &&
      (iVar7 = (*on_extract)(local_aa8,local_ab0), iVar6 = iVar5, iVar7 < 0)) ||
     (file_index = file_index + 1, iVar6 = iVar5, local_ac4 <= file_index)) goto LAB_00110892;
  mVar4 = mz_zip_reader_file_stat(zip_archive,file_index,&local_8a0);
  if (mVar4 == 0) goto LAB_00110889;
  goto LAB_001105f2;
}

Assistant:

static int zip_archive_extract(mz_zip_archive *zip_archive, const char *dir,
                               int (*on_extract)(const char *filename,
                                                 void *arg),
                               void *arg) {
  int err = 0;
  mz_uint i, n;
  char path[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  char symlink_to[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  mz_zip_archive_file_stat info;
  size_t dirlen = 0, filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE;
  mz_uint32 xattr = 0;

  memset(path, 0, sizeof(path));
  memset(symlink_to, 0, sizeof(symlink_to));

  dirlen = strlen(dir);
  if (dirlen + 1 > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE) {
    return ZIP_EINVENTNAME;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));

#if defined(_MSC_VER)
  strcpy_s(path, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, dir);
#else
  strncpy(path, dir, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE);
#endif

  if (!ISSLASH(path[dirlen - 1])) {
#if defined(_WIN32) || defined(__WIN32__)
    path[dirlen] = '\\';
#else
    path[dirlen] = '/';
#endif
    ++dirlen;
  }

  if (filename_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen) {
    filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen;
  }
  // Get and print information about each file in the archive.
  n = mz_zip_reader_get_num_files(zip_archive);
  for (i = 0; i < n; ++i) {
    if (!mz_zip_reader_file_stat(zip_archive, i, &info)) {
      // Cannot get information about zip archive;
      err = ZIP_ENOENT;
      goto out;
    }

    if (!zip_name_normalize(info.m_filename, info.m_filename,
                            strlen(info.m_filename))) {
      // Cannot normalize file name;
      err = ZIP_EINVENTNAME;
      goto out;
    }

#if defined(_MSC_VER)
    strncpy_s(&path[dirlen], filename_size, info.m_filename, filename_size);
#else
    strncpy(&path[dirlen], info.m_filename, filename_size);
#endif
    err = zip_mkpath(path);
    if (err < 0) {
      // Cannot make a path
      goto out;
    }

    if ((((info.m_version_made_by >> 8) == 3) ||
         ((info.m_version_made_by >> 8) ==
          19)) // if zip is produced on Unix or macOS (3 and 19 from
               // section 4.4.2.2 of zip standard)
        && info.m_external_attr &
               (0x20 << 24)) { // and has sym link attribute (0x80 is file,
                               // 0x40 is directory)
#if defined(_WIN32) || defined(__WIN32__) || defined(_MSC_VER) ||              \
    defined(__MINGW32__)
#else
      if (info.m_uncomp_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE ||
          !mz_zip_reader_extract_to_mem_no_alloc(
              zip_archive, i, symlink_to, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, 0,
              NULL, 0)) {
        err = ZIP_EMEMNOALLOC;
        goto out;
      }
      symlink_to[info.m_uncomp_size] = '\0';
      if (symlink(symlink_to, path) != 0) {
        err = ZIP_ESYMLINK;
        goto out;
      }
#endif
    } else {
      if (!mz_zip_reader_is_file_a_directory(zip_archive, i)) {
        if (!mz_zip_reader_extract_to_file(zip_archive, i, path, 0)) {
          // Cannot extract zip archive to file
          err = ZIP_ENOFILE;
          goto out;
        }
      }

#if defined(_MSC_VER) || defined(PS4)
      (void)xattr; // unused
#else
      xattr = (info.m_external_attr >> 16) & 0xFFFF;
      if (xattr > 0 && xattr <= MZ_UINT16_MAX) {
        if (CHMOD(path, (mode_t)xattr) < 0) {
          err = ZIP_ENOPERM;
          goto out;
        }
      }
#endif
    }

    if (on_extract) {
      if (on_extract(path, arg) < 0) {
        goto out;
      }
    }
  }

out:
  // Close the archive, freeing any resources it was using
  if (!mz_zip_reader_end(zip_archive)) {
    // Cannot end zip reader
    err = ZIP_ECLSZIP;
  }
  return err;
}